

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

void CorUnix::CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress
               (CPalThread *pthrCurrent,WaitingThreadsListNode *pwtlnNode)

{
  DWORD *pDVar1;
  uint uVar2;
  _ThreadWaitInfo *p_Var3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = pwtlnNode->dwFlags;
  if (gPID != pwtlnNode->dwProcessId) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb0a);
    fprintf(_stderr,
            "Expression: gPID == pwtlnNode->dwProcessId, Description: MarkWaitForDelegatedObjectSignalingInProgress() called from the wrong process"
           );
  }
  p_Var3 = pwtlnNode->ptwiWaitInfo;
  if (((uVar2 & 1) == 0) && (p_Var3->wdWaitDomain != LocalWait)) {
    AcquireSharedSynchLock(pthrCurrent);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  if (p_Var3->wtWaitType != MultipleObjectsWaitAll) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb17);
    fprintf(_stderr,
            "Expression: MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType, Description: MarkWaitForDelegatedObjectSignalingInProgress() called on a normal (non wait-all) wait"
           );
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)p_Var3->lObjCount;
  if (p_Var3->lObjCount < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pDVar1 = &p_Var3->rgpWTLNodes[uVar6]->dwFlags;
    *pDVar1 = *pDVar1 & 0xfffffffb;
  }
  *(byte *)&pwtlnNode->dwFlags = (byte)pwtlnNode->dwFlags | 4;
  if (bVar4) {
    ReleaseSharedSynchLock(pthrCurrent);
    return;
  }
  return;
}

Assistant:

void CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress(
        CPalThread * pthrCurrent,
        WaitingThreadsListNode * pwtlnNode)
    {
        int i, iTgtCount;
        ThreadWaitInfo * ptwiWaitInfo = NULL;
        bool fSharedSynchLock = false;
        bool fTargetObjectIsShared =
            (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags));

        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(gPID == pwtlnNode->dwProcessId,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "from the wrong process");

        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        if (!fSharedSynchLock && !fTargetObjectIsShared &&
            LocalWait != ptwiWaitInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        _ASSERT_MSG(MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "on a normal (non wait-all) wait");

        // Unmark all node other than the target one
        iTgtCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iTgtCount; i++)
        {
            VALIDATEOBJECT(ptwiWaitInfo->rgpWTLNodes[i]);

            ptwiWaitInfo->rgpWTLNodes[i]->dwFlags &=
                ~WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;
        }

        // Mark the target node
        pwtlnNode->dwFlags |= WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;

        // Done
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        return;
    }